

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

ctmbstr prvTidyGetNextDeclaredTag(TidyDocImpl *doc,UserTagType tagType,TidyIterator *iter)

{
  ctmbstr ptVar1;
  TidyIterator p_Var2;
  
  p_Var2 = *iter;
  if (p_Var2 == (TidyIterator)0x0) {
    ptVar1 = (ctmbstr)0x0;
    p_Var2 = (TidyIterator)0x0;
  }
  else {
    do {
      ptVar1 = (ctmbstr)0x0;
      switch(tagType) {
      case tagtype_empty:
        if ((p_Var2[8]._opaque & 1) == 0) break;
LAB_0014626d:
        ptVar1 = *(ctmbstr *)(p_Var2 + 2);
        goto switchD_0014623c_caseD_3;
      case tagtype_inline:
        if ((p_Var2[8]._opaque & 0x10) != 0) goto LAB_0014626d;
        break;
      default:
        goto switchD_0014623c_caseD_3;
      case tagtype_block:
        if (((p_Var2[8]._opaque & 8) != 0) && (*(code **)(p_Var2 + 10) == prvTidyParseBlock))
        goto LAB_0014626d;
        break;
      case tagtype_pre:
        if (((p_Var2[8]._opaque & 8) != 0) && (*(code **)(p_Var2 + 10) == prvTidyParsePre))
        goto LAB_0014626d;
      }
      ptVar1 = (ctmbstr)0x0;
switchD_0014623c_caseD_3:
      p_Var2 = *(TidyIterator *)(p_Var2 + 0xe);
    } while ((ptVar1 == (ctmbstr)0x0) && (p_Var2 != (TidyIterator)0x0));
  }
  *iter = p_Var2;
  return ptVar1;
}

Assistant:

ctmbstr        TY_(GetNextDeclaredTag)( TidyDocImpl* ARG_UNUSED(doc),
                                        UserTagType tagType, TidyIterator* iter )
{
    ctmbstr name = NULL;
    Dict* curr;
    for ( curr = (Dict*) *iter; name == NULL && curr != NULL; curr = curr->next )
    {
        switch ( tagType )
        {
        case tagtype_empty:
            if ( (curr->model & CM_EMPTY) != 0 )
                name = curr->name;
            break;

        case tagtype_inline:
            if ( (curr->model & CM_INLINE) != 0 )
                name = curr->name;
            break;

        case tagtype_block:
            if ( (curr->model & CM_BLOCK) != 0 &&
                 curr->parser == TY_(ParseBlock) )
                name = curr->name;
            break;

        case tagtype_pre:
            if ( (curr->model & CM_BLOCK) != 0 &&
                 curr->parser == TY_(ParsePre) )
                name = curr->name;
            break;

        case tagtype_null:
            break;
        }
    }
    *iter = (TidyIterator) curr;
    return name;
}